

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

void MultiplicationHelper<signed_char,_unsigned_long_long,_13>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char t,uint64_t *u,char *ret)

{
  undefined3 in_register_00000039;
  int32_t tmp;
  uint64_t u1;
  int32_t local_1c;
  uint64_t local_18;
  
  local_18 = *u;
  local_1c = 0;
  LargeIntRegMultiply<int,_unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (CONCAT31(in_register_00000039,t),&local_18,&local_1c);
  if ((char)local_1c == local_1c) {
    *ret = (char)local_1c;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void MultiplyThrow(T t, const std::uint64_t& u, T& ret) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isUint64, "U must be Uint64");
        std::uint64_t u1 = u;
        std::int32_t tmp = 0;

        LargeIntRegMultiply< std::int32_t, std::uint64_t >::template RegMultiplyThrow< E >( (std::int32_t)t, u1, &tmp );
        SafeCastHelper< T, std::int32_t, GetCastMethod< T, std::int32_t >::method >::template CastThrow< E >( tmp, ret );
    }